

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint auto_choose_color_from_profile
               (LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,LodePNGColorProfile *prof)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  int *in_RDX;
  int *in_RSI;
  uint *in_RDI;
  uint mask;
  uchar *p;
  uint bits;
  uint key;
  uint alpha;
  size_t numpixels;
  size_t n;
  size_t i;
  uint palette_ok;
  uint palettebits;
  uint error;
  undefined4 in_stack_ffffffffffffff90;
  uchar in_stack_ffffffffffffff94;
  byte bVar4;
  uchar in_stack_ffffffffffffff95;
  uchar in_stack_ffffffffffffff96;
  uchar in_stack_ffffffffffffff97;
  uint3 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint local_60;
  uint local_4c;
  int local_48;
  int local_44;
  ulong local_30;
  uint local_24;
  uint local_1c;
  
  local_1c = 0;
  uVar1 = *(ulong *)(in_RDX + 0x108);
  local_44 = in_RDX[4];
  local_48 = in_RDX[1];
  local_4c = in_RDX[0x106];
  in_RDI[6] = 0;
  if ((local_48 != 0) && (uVar1 < 0x11)) {
    local_44 = 1;
    local_48 = 0;
    if (local_4c < 8) {
      local_4c = 8;
    }
  }
  uVar3 = (ulong)(uint)in_RDX[5];
  if (uVar3 < 3) {
    local_60 = 1;
  }
  else if (uVar3 < 5) {
    in_stack_ffffffffffffff9c = 2;
    local_60 = in_stack_ffffffffffffff9c;
  }
  else {
    in_stack_ffffffffffffff9c = 8;
    local_60 = in_stack_ffffffffffffff9c;
    if (uVar3 < 0x11) {
      in_stack_ffffffffffffff9c = 4;
      local_60 = in_stack_ffffffffffffff9c;
    }
  }
  uVar2 = (uint)in_stack_ffffffffffffff98;
  if (uVar3 < 0x101) {
    uVar2 = CONCAT13(local_4c < 9,in_stack_ffffffffffffff98);
  }
  local_24 = uVar2 >> 0x18;
  if (uVar1 < uVar3 << 1) {
    local_24 = 0;
  }
  if ((*in_RDX == 0) && (local_4c <= local_60)) {
    local_24 = 0;
  }
  if (local_24 == 0) {
    in_RDI[1] = local_4c;
    if (local_44 == 0) {
      bVar4 = 0;
      if (*in_RDX != 0) {
        bVar4 = 2;
      }
    }
    else {
      bVar4 = 4;
      if (*in_RDX != 0) {
        bVar4 = 6;
      }
    }
    *in_RDI = (uint)bVar4;
    if (local_48 != 0) {
      uVar2 = (1 << ((byte)in_RDI[1] & 0x1f)) - 1;
      in_RDI[7] = *(ushort *)(in_RDX + 2) & uVar2;
      in_RDI[8] = *(ushort *)((long)in_RDX + 10) & uVar2;
      in_RDI[9] = *(ushort *)(in_RDX + 3) & uVar2;
      in_RDI[6] = 1;
    }
  }
  else {
    lodepng_palette_clear((LodePNGColorMode *)0x10a0bf);
    local_30 = 0;
    while ((local_30 != (uint)in_RDX[5] &&
           (local_1c = lodepng_palette_add((LodePNGColorMode *)
                                           CONCAT44(in_stack_ffffffffffffff9c,uVar2),
                                           in_stack_ffffffffffffff97,in_stack_ffffffffffffff96,
                                           in_stack_ffffffffffffff95,in_stack_ffffffffffffff94),
           local_1c == 0))) {
      local_30 = local_30 + 1;
    }
    *in_RDI = 3;
    in_RDI[1] = local_60;
    if (((*in_RSI == 3) && (*(ulong *)(in_RDI + 4) <= *(ulong *)(in_RSI + 4))) &&
       (in_RSI[1] == in_RDI[1])) {
      lodepng_color_mode_cleanup((LodePNGColorMode *)0x10a1af);
      lodepng_color_mode_copy
                ((LodePNGColorMode *)CONCAT44(in_stack_ffffffffffffff9c,uVar2),
                 (LodePNGColorMode *)
                 CONCAT17(in_stack_ffffffffffffff97,
                          CONCAT16(in_stack_ffffffffffffff96,
                                   CONCAT15(in_stack_ffffffffffffff95,
                                            CONCAT14(in_stack_ffffffffffffff94,
                                                     in_stack_ffffffffffffff90)))));
    }
  }
  return local_1c;
}

Assistant:

static unsigned auto_choose_color_from_profile(LodePNGColorMode* mode_out,
                                               const LodePNGColorMode* mode_in,
                                               const LodePNGColorProfile* prof)
{
  unsigned error = 0;
  unsigned palettebits, palette_ok;
  size_t i, n;
  size_t numpixels = prof->numpixels;

  unsigned alpha = prof->alpha;
  unsigned key = prof->key;
  unsigned bits = prof->bits;

  mode_out->key_defined = 0;

  if(key && numpixels <= 16)
  {
    alpha = 1; /*too few pixels to justify tRNS chunk overhead*/
    key = 0;
    if(bits < 8) bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
  }
  n = prof->numcolors;
  palettebits = n <= 2 ? 1 : (n <= 4 ? 2 : (n <= 16 ? 4 : 8));
  palette_ok = n <= 256 && bits <= 8;
  if(numpixels < n * 2) palette_ok = 0; /*don't add palette overhead if image has only a few pixels*/
  if(!prof->colored && bits <= palettebits) palette_ok = 0; /*grey is less overhead*/

  if(palette_ok)
  {
    const unsigned char* p = prof->palette;
    lodepng_palette_clear(mode_out); /*remove potential earlier palette*/
    for(i = 0; i != prof->numcolors; ++i)
    {
      error = lodepng_palette_add(mode_out, p[i * 4 + 0], p[i * 4 + 1], p[i * 4 + 2], p[i * 4 + 3]);
      if(error) break;
    }

    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = palettebits;

    if(mode_in->colortype == LCT_PALETTE && mode_in->palettesize >= mode_out->palettesize
        && mode_in->bitdepth == mode_out->bitdepth)
    {
      /*If input should have same palette colors, keep original to preserve its order and prevent conversion*/
      lodepng_color_mode_cleanup(mode_out);
      lodepng_color_mode_copy(mode_out, mode_in);
    }
  }
  else /*8-bit or 16-bit per channel*/
  {
    mode_out->bitdepth = bits;
    mode_out->colortype = alpha ? (prof->colored ? LCT_RGBA : LCT_GREY_ALPHA)
                                : (prof->colored ? LCT_RGB : LCT_GREY);

    if(key)
    {
      unsigned mask = (1u << mode_out->bitdepth) - 1u; /*profile always uses 16-bit, mask converts it*/
      mode_out->key_r = prof->key_r & mask;
      mode_out->key_g = prof->key_g & mask;
      mode_out->key_b = prof->key_b & mask;
      mode_out->key_defined = 1;
    }
  }

  return error;
}